

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O2

void mark_chests(dw_rom *rom,uint8_t flag)

{
  uint8_t *puVar1;
  dw_chest *pdVar2;
  dungeon_map *pdVar3;
  size_t i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x1f; lVar4 = lVar4 + 1) {
    pdVar2 = rom->chests;
    pdVar3 = get_map((uint)pdVar2[lVar4].map);
    if ((((pdVar3 != (dungeon_map *)0x0) &&
         (pdVar3->tiles[pdVar2[lVar4].x][pdVar2[lVar4].y] == '\f')) &&
        (rom->chest_access[lVar4] = rom->chest_access[lVar4] | flag, (flag & 0xf) != 0)) &&
       (pdVar2[lVar4].item == '\x03')) {
      puVar1 = &(rom->map).key_access;
      *puVar1 = *puVar1 | flag;
    }
  }
  return;
}

Assistant:

static void mark_chests(dw_rom *rom, uint8_t flag)
{
    size_t i, x, y;
    dw_chest *chest;
    dungeon_map *map;

    for (i = 0; i < CHEST_COUNT; i++) {
        chest = &rom->chests[i];
        map = get_map(chest->map);
        if (!map)
            continue;
        x = chest->x;
        y = chest->y;
        if (map->tiles[x][y] == (DUNGEON_TILE_CHEST | 8)) {
            rom->chest_access[i] |= flag;
            if (flag & 0xf && chest->item == KEY)
                rom->map.key_access |= flag;
        }
    }
}